

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

void __thiscall
crnlib::vector<crnlib::vector<unsigned_char>_>::push_back
          (vector<crnlib::vector<unsigned_char>_> *this,vector<unsigned_char> *obj)

{
  vector<unsigned_char> *obj_local;
  vector<crnlib::vector<unsigned_char>_> *this_local;
  
  if (this->m_capacity <= this->m_size) {
    increase_capacity(this,this->m_size + 1,true,false);
  }
  scalar_type<crnlib::vector<unsigned_char>_>::construct(this->m_p + this->m_size,obj);
  this->m_size = this->m_size + 1;
  return;
}

Assistant:

inline void push_back(const T& obj)
        {
            CRNLIB_ASSERT(!m_p || (&obj < m_p) || (&obj >= (m_p + m_size)));

            if (m_size >= m_capacity)
            {
                increase_capacity(m_size + 1, true);
            }

            scalar_type<T>::construct(m_p + m_size, obj);
            m_size++;
        }